

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

bool WScriptJsrt::PrintException(LPCSTR fileName,JsErrorCode jsErrorCode,JsValueRef exception)

{
  JsErrorCode JVar1;
  LPCWSTR pWVar2;
  PAL_FILE *pPVar3;
  LPWSTR pWVar4;
  char *_Path;
  bool bVar5;
  bool bVar6;
  char local_2c8 [8];
  CHAR ext [256];
  JsPropertyIdRef exceptionId;
  undefined1 auStack_b8 [8];
  AutoString errorMessage;
  JsPropertyIdRef messagePropertyId;
  int local_70;
  int local_6c;
  int line;
  int column;
  JsPropertyIdRef columnPropertyId;
  JsValueRef columnProperty;
  JsValueRef metaData;
  JsValueRef message;
  JsValueRef exception_local;
  JsPropertyIdRef linePropertyId;
  JsValueRef lineProperty;
  bool hasException;
  
  message = exception;
  pWVar2 = ConvertErrorCodeToMessage(jsErrorCode);
  columnProperty = (JsValueRef)0x0;
  if (message == (JsValueRef)0x0) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata)
                      (&columnProperty);
    if (JVar1 == JsNoError) {
      ext[0xf8] = '\0';
      ext[0xf9] = '\0';
      ext[0xfa] = '\0';
      ext[0xfb] = '\0';
      ext[0xfc] = '\0';
      ext[0xfd] = '\0';
      ext[0xfe] = '\0';
      ext[0xff] = '\0';
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                        ("exception",9,(JsPropertyIdRef *)(ext + 0xf8));
      if (JVar1 != JsNoError) {
        return false;
      }
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                        (columnProperty,(JsPropertyIdRef)ext._248_8_,&message);
    }
    else {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearException)(&message);
    }
    if (JVar1 != JsNoError) {
      return false;
    }
  }
  if (HostConfigFlags::flags.MuteHostErrorMsgIsEnabled != false) {
    return false;
  }
  if (message == (JsValueRef)0x0) {
    pPVar3 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar3,L"Error : %ls\n",pWVar2);
    return false;
  }
  if (1 < jsErrorCode - JsErrorScriptException) {
    pPVar3 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar3,L"Error : %ls\n",pWVar2);
    return true;
  }
  errorMessage.data._0_5_ = 0;
  errorMessage._13_8_ = 0;
  auStack_b8 = (undefined1  [8])0x0;
  errorMessage.length._0_5_ = 0;
  errorMessage.length._5_3_ = 0;
  JVar1 = AutoString::Initialize((AutoString *)auStack_b8,message);
  if (JVar1 == JsNoError) {
    bVar5 = false;
LAB_0011240b:
    if (jsErrorCode == JsErrorScriptCompile) {
      errorMessage.errorCode = JsNoError;
      errorMessage.dontFree = false;
      errorMessage._29_3_ = 0;
      metaData = (JsValueRef)0x0;
      exception_local = (JsValueRef)0x0;
      linePropertyId = (JsPropertyIdRef)0x0;
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                        ("line",4,(JsPropertyIdRef *)&errorMessage.errorCode);
      if (((((JVar1 == JsNoError) &&
            (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                               (message,(JsPropertyIdRef)errorMessage._24_8_,&metaData),
            JVar1 == JsNoError)) &&
           (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(metaData,&line),
           JVar1 == JsNoError)) &&
          ((JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                              ("column",6,&exception_local), JVar1 == JsNoError &&
           (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                              (message,exception_local,&linePropertyId), JVar1 == JsNoError)))) &&
         (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                            (linePropertyId,(int *)&columnPropertyId), JVar1 == JsNoError)) {
        _splitpath_s(fileName,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
        PAL_fwprintf(pPVar3,L"%ls\n\tat code (%S%S:%d:%d)\n",pWVar4,ext + 0xf8,local_2c8,
                     (ulong)(line + 1),(ulong)((int)columnPropertyId + 1));
        bVar6 = true;
      }
      else {
        bVar6 = false;
        bVar5 = false;
      }
    }
    else {
      linePropertyId = (JsPropertyIdRef)((ulong)linePropertyId & 0xffffffff00000000);
      metaData = (JsValueRef)0x0;
      exception_local = (JsValueRef)0x0;
      errorMessage.errorCode = JsNoError;
      errorMessage.dontFree = false;
      errorMessage._29_3_ = 0;
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)("stack",5,&metaData);
      bVar6 = true;
      if ((JVar1 == JsNoError) &&
         (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                            (message,metaData,&exception_local), JVar1 == JsNoError)) {
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetValueType)
                          (exception_local,(JsValueType *)&linePropertyId);
        bVar6 = JVar1 != JsNoError;
      }
      if ((bVar6) || ((int)linePropertyId == 0)) {
        _Path = "(unknown)";
        if (fileName != (LPCSTR)0x0) {
          _Path = fileName;
        }
        _splitpath_s(_Path,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
        pPVar3 = PAL_get_stderr(0);
        PAL_fprintf(pPVar3,"thrown at %s%s:\n^\n",ext + 0xf8,local_2c8);
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
        PAL_fwprintf(pPVar3,L"%ls\n",pWVar4);
        bVar6 = true;
      }
      else {
        JVar1 = AutoString::Initialize((AutoString *)&errorMessage.errorCode,exception_local);
        if (JVar1 == JsNoError) {
          pPVar3 = PAL_get_stderr(0);
          pWVar4 = AutoString::GetWideString
                             ((AutoString *)&errorMessage.errorCode,(charcount_t *)0x0);
          bVar6 = true;
          PAL_fwprintf(pPVar3,L"%ls\n",pWVar4);
        }
        else {
          bVar6 = false;
          bVar5 = false;
        }
      }
      AutoString::~AutoString((AutoString *)&errorMessage.errorCode);
    }
    if (bVar6) {
      bVar6 = true;
      goto LAB_00112763;
    }
  }
  else {
    pPVar3 = PAL_get_stderr(0);
    PAL_fwprintf(pPVar3,L"ERROR attempting to coerce error to string, using alternate handler\n");
    lineProperty._7_1_ = '\0';
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtHasException)((bool *)((long)&lineProperty + 7));
    if (lineProperty._7_1_ == '\x01') {
      ext[0xf8] = '\0';
      ext[0xf9] = '\0';
      ext[0xfa] = '\0';
      ext[0xfb] = '\0';
      ext[0xfc] = '\0';
      ext[0xfd] = '\0';
      ext[0xfe] = '\0';
      ext[0xff] = '\0';
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetAndClearException)((JsValueRef *)(ext + 0xf8));
    }
    errorMessage.errorCode = JsNoError;
    errorMessage.dontFree = false;
    errorMessage._29_3_ = 0;
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                      ("message",7,(JsPropertyIdRef *)&errorMessage.errorCode);
    if (JVar1 == JsNoError) {
      metaData = (JsValueRef)0x0;
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                        (message,(JsPropertyIdRef)errorMessage._24_8_,&metaData);
      if (JVar1 != JsNoError) goto LAB_00112341;
      JVar1 = AutoString::Initialize((AutoString *)auStack_b8,metaData);
      bVar6 = JVar1 == JsNoError;
      if (!bVar6 || jsErrorCode == JsErrorScriptCompile) goto LAB_00112343;
      _splitpath_s(fileName,(char *)0x0,0,(char *)0x0,0,ext + 0xf8,0x104,local_2c8,0x100);
      if (columnProperty == (JsValueRef)0x0) {
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
        bVar5 = true;
        PAL_fwprintf(pPVar3,L"%ls\n\tat code (%S%S:??:??)\n",pWVar4);
      }
      else {
        exception_local = (JsValueRef)0x0;
        linePropertyId = (JsPropertyIdRef)0x0;
        _line = (JsPropertyIdRef)0x0;
        columnPropertyId = (JsPropertyIdRef)0x0;
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)("line",4,&exception_local)
        ;
        if ((((JVar1 == JsNoError) &&
             (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                (columnProperty,exception_local,&linePropertyId), JVar1 == JsNoError
             )) && (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                                      (linePropertyId,&local_70), JVar1 == JsNoError)) &&
           (((JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreatePropertyId)
                                ("column",6,(JsPropertyIdRef *)&line), JVar1 == JsNoError &&
             (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                                (columnProperty,_line,&columnPropertyId), JVar1 == JsNoError)) &&
            (JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                               (columnPropertyId,&local_6c), JVar1 == JsNoError)))) {
          pPVar3 = PAL_get_stderr(0);
          pWVar4 = AutoString::GetWideString((AutoString *)auStack_b8,(charcount_t *)0x0);
          PAL_fwprintf(pPVar3,L"%ls\n        at code (%S%S:%d:%d)\n",pWVar4,ext + 0xf8,local_2c8,
                       (ulong)(local_70 + 1),(ulong)(local_6c + 1));
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      }
      bVar6 = false;
    }
    else {
LAB_00112341:
      bVar6 = false;
LAB_00112343:
      bVar5 = false;
    }
    if (bVar6) goto LAB_0011240b;
  }
  bVar6 = false;
LAB_00112763:
  AutoString::~AutoString((AutoString *)auStack_b8);
  if (bVar6) {
    return true;
  }
  return bVar5;
}

Assistant:

bool WScriptJsrt::PrintException(LPCSTR fileName, JsErrorCode jsErrorCode, JsValueRef exception)
{
    LPCWSTR errorTypeString = ConvertErrorCodeToMessage(jsErrorCode);
    JsValueRef metaData = JS_INVALID_REFERENCE;

    if (exception == nullptr)
    {
        if (ChakraRTInterface::JsGetAndClearExceptionWithMetadata(&metaData) == JsNoError)
        {
            JsPropertyIdRef exceptionId = JS_INVALID_REFERENCE;
            IfJsrtErrorFail(CreatePropertyIdFromString("exception", &exceptionId), false);
            IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, exceptionId, &exception), false);
        }
        else
        {
            IfJsrtErrorFail(ChakraRTInterface::JsGetAndClearException(&exception), false);
        }

    }

    if (HostConfigFlags::flags.MuteHostErrorMsgIsEnabled)
    {
        return false;
    }

    if (exception != nullptr)
    {
        if (jsErrorCode == JsErrorCode::JsErrorScriptCompile || jsErrorCode == JsErrorCode::JsErrorScriptException)
        {
            AutoString errorMessage;

            if (errorMessage.Initialize(exception) != JsNoError)
            {
                fwprintf(stderr, _u("ERROR attempting to coerce error to string, using alternate handler\n"));
                bool hasException = false;
                ChakraRTInterface::JsHasException(&hasException);
                if (hasException)
                {
                    JsValueRef throwAway = JS_INVALID_REFERENCE;
                    ChakraRTInterface::JsGetAndClearException(&throwAway);
                }
                JsPropertyIdRef messagePropertyId = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(CreatePropertyIdFromString("message", &messagePropertyId), false);
                JsValueRef message = JS_INVALID_REFERENCE;
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, messagePropertyId, &message), false);
                IfJsrtErrorFail(errorMessage.Initialize(message), false);

                if (jsErrorCode != JsErrorCode::JsErrorScriptCompile)
                {
                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    if (metaData != JS_INVALID_REFERENCE)
                    {
                        JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                        JsValueRef lineProperty = JS_INVALID_REFERENCE;

                        JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                        JsValueRef columnProperty = JS_INVALID_REFERENCE;
                        
                        int line;
                        int column;
                        
                        IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, linePropertyId, &lineProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                        IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(metaData, columnPropertyId, &columnProperty), false);
                        IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);
                        fwprintf(stderr, _u("%ls\n        at code (%S%S:%d:%d)\n"),
                            errorMessage.GetWideString(), shortFileName, ext, line + 1, column + 1);
                    }
                    else
                    {
                        fwprintf(stderr, _u("%ls\n\tat code (%S%S:\?\?:\?\?)\n"), errorMessage.GetWideString(), shortFileName, ext);
                    }
                    return true;
                }
            }

            if (jsErrorCode == JsErrorCode::JsErrorScriptCompile)
            {
                JsPropertyIdRef linePropertyId = JS_INVALID_REFERENCE;
                JsValueRef lineProperty = JS_INVALID_REFERENCE;

                JsPropertyIdRef columnPropertyId = JS_INVALID_REFERENCE;
                JsValueRef columnProperty = JS_INVALID_REFERENCE;

                int line;
                int column;
                
                IfJsrtErrorFail(CreatePropertyIdFromString("line", &linePropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, linePropertyId, &lineProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(lineProperty, &line), false);

                IfJsrtErrorFail(CreatePropertyIdFromString("column", &columnPropertyId), false);
                IfJsrtErrorFail(ChakraRTInterface::JsGetProperty(exception, columnPropertyId, &columnProperty), false);
                IfJsrtErrorFail(ChakraRTInterface::JsNumberToInt(columnProperty, &column), false);

                CHAR shortFileName[_MAX_PATH];
                CHAR ext[_MAX_EXT];
                _splitpath_s(fileName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));
                fwprintf(stderr, _u("%ls\n\tat code (%S%S:%d:%d)\n"),
                    errorMessage.GetWideString(), shortFileName, ext, (int)line + 1,
                    (int)column + 1);
            }
            else
            {
                JsValueType propertyType = JsUndefined;
                JsPropertyIdRef stackPropertyId = JS_INVALID_REFERENCE;
                JsValueRef stackProperty = JS_INVALID_REFERENCE;
                AutoString errorStack;

                JsErrorCode errorCode = CreatePropertyIdFromString("stack", &stackPropertyId);

                if (errorCode == JsErrorCode::JsNoError)
                {
                    errorCode = ChakraRTInterface::JsGetProperty(exception, stackPropertyId, &stackProperty);
                    if (errorCode == JsErrorCode::JsNoError)
                    {
                        errorCode = ChakraRTInterface::JsGetValueType(stackProperty, &propertyType);
                    }
                }

                if (errorCode != JsErrorCode::JsNoError || propertyType == JsUndefined)
                {
                    const char *fName = fileName != nullptr ? fileName : "(unknown)";

                    CHAR shortFileName[_MAX_PATH];
                    CHAR ext[_MAX_EXT];
                    _splitpath_s(fName, nullptr, 0, nullptr, 0, shortFileName, _countof(shortFileName), ext, _countof(ext));

                    // do not mix char/wchar. print them separately
                    fprintf(stderr, "thrown at %s%s:\n^\n", shortFileName, ext);
                    fwprintf(stderr, _u("%ls\n"), errorMessage.GetWideString());
                }
                else
                {
                    IfJsrtErrorFail(errorStack.Initialize(stackProperty), false);
                    fwprintf(stderr, _u("%ls\n"), errorStack.GetWideString());
                }
            }
        }
        else
        {
            fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
        }
        return true;
    }
    else
    {
        fwprintf(stderr, _u("Error : %ls\n"), errorTypeString);
    }
    return false;
}